

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_lpf1_reinit(ma_lpf1_config *pConfig,ma_lpf1 *pLPF)

{
  ma_int32 mVar1;
  int *in_RSI;
  int *in_RDI;
  double x;
  double a;
  ma_result local_c;
  
  if ((in_RSI == (int *)0x0) || (in_RDI == (int *)0x0)) {
    local_c = MA_INVALID_ARGS;
  }
  else if ((*in_RDI == 5) || (*in_RDI == 2)) {
    if ((*in_RSI == 0) || (*in_RSI == *in_RDI)) {
      if ((in_RSI[1] == 0) || (in_RSI[1] == in_RDI[1])) {
        *in_RSI = *in_RDI;
        in_RSI[1] = in_RDI[1];
        x = exp((*(double *)(in_RDI + 4) * -6.283185307179586) / (double)(uint)in_RDI[2]);
        if (*in_RDI == 5) {
          in_RSI[2] = (int)(float)x;
        }
        else {
          mVar1 = ma_biquad_float_to_fp(x);
          in_RSI[2] = mVar1;
        }
        local_c = MA_SUCCESS;
      }
      else {
        local_c = MA_INVALID_OPERATION;
      }
    }
    else {
      local_c = MA_INVALID_OPERATION;
    }
  }
  else {
    local_c = MA_INVALID_ARGS;
  }
  return local_c;
}

Assistant:

MA_API ma_result ma_lpf1_reinit(const ma_lpf1_config* pConfig, ma_lpf1* pLPF)
{
    double a;

    if (pLPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pLPF->format != ma_format_unknown && pLPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pLPF->channels != 0 && pLPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    pLPF->format   = pConfig->format;
    pLPF->channels = pConfig->channels;

    a = ma_expd(-2 * MA_PI_D * pConfig->cutoffFrequency / pConfig->sampleRate);
    if (pConfig->format == ma_format_f32) {
        pLPF->a.f32 = (float)a;
    } else {
        pLPF->a.s32 = ma_biquad_float_to_fp(a);
    }

    return MA_SUCCESS;
}